

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  undefined4 in_register_0000003c;
  long *plVar4;
  undefined8 uVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  text local_108;
  text local_e8;
  undefined1 local_c8 [32];
  text local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar4 = (long *)CONCAT44(in_register_0000003c,__nfds);
  this = &local_48;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar7 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar4,plVar4[1] + *plVar4);
    bVar1 = hidden(&local_68);
    uVar3 = (uint)CONCAT71(extraout_var,bVar1);
    uVar5 = local_68._M_dataplus._M_p;
LAB_0010fc1f:
    uVar3 = uVar3 ^ 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar5 != paVar7) {
      operator_delete((void *)uVar5,paVar7->_M_allocated_capacity + 1);
    }
  }
  else if (__readfds->fds_bits[1] == __readfds->fds_bits[0]) {
LAB_0010fc78:
    uVar3 = 0;
  }
  else {
    plVar6 = (long *)(__readfds->fds_bits[1] + -0x20);
    iVar2 = std::__cxx11::string::compare((char *)plVar6);
    if (iVar2 != 0) {
      this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_c8 + 0x10);
      do {
        iVar2 = std::__cxx11::string::compare((char *)plVar6);
        if (iVar2 == 0) break;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_e8,*plVar6,plVar6[1] + *plVar6);
        local_c8._0_8_ = this;
        std::__cxx11::string::_M_construct<char*>((string *)local_c8,*plVar4,plVar4[1] + *plVar4);
        bVar1 = search(&local_e8,(text *)local_c8);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8._0_8_ != this) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (bVar1) break;
        if (*(char *)*plVar6 == '!') {
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)plVar6);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,*plVar4,plVar4[1] + *plVar4);
          bVar1 = search(&local_a8,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (bVar1) goto LAB_0010fc78;
          if (plVar6 == (long *)__readfds->fds_bits[0]) {
            paVar7 = &local_78;
            local_88._M_allocated_capacity = (size_type)paVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,*plVar4,plVar4[1] + *plVar4);
            bVar1 = hidden((text *)&local_88);
            uVar3 = (uint)CONCAT71(extraout_var_00,bVar1);
            uVar5 = local_88._M_allocated_capacity;
            goto LAB_0010fc1f;
          }
        }
        else if (plVar6 == (long *)__readfds->fds_bits[0]) goto LAB_0010fc78;
        plVar6 = plVar6 + -4;
        iVar2 = std::__cxx11::string::compare((char *)plVar6);
      } while (iVar2 != 0);
    }
    uVar3 = (uint)CONCAT71((int7)((ulong)this >> 8),1);
  }
  return uVar3;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}